

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TMS320C64xMapping.c
# Opt level: O1

char * TMS320C64x_group_name(csh handle,uint id)

{
  long lVar1;
  
  if (0x84 < id) {
    return (char *)0x0;
  }
  lVar1 = 0;
  do {
    if (*(uint *)((long)&group_name_maps[0].id + lVar1) == id) goto LAB_0026f1dc;
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x70);
  lVar1 = (ulong)id << 4;
LAB_0026f1dc:
  return *(char **)((long)&group_name_maps[0].name + lVar1);
}

Assistant:

const char *TMS320C64x_group_name(csh handle, unsigned int id)
{
#ifndef CAPSTONE_DIET
	unsigned int i;

	if (id >= TMS320C64X_GRP_ENDING)
		return NULL;

	for (i = 0; i < ARR_SIZE(group_name_maps); i++) {
		if (group_name_maps[i].id == id)
			return group_name_maps[i].name;
	}

	return group_name_maps[id].name;
#else
	return NULL;
#endif
}